

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O2

void __thiscall rtosc::Ports::refreshMagic(Ports *this)

{
  ivec_t *pos;
  long lVar1;
  pointer pvVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  Port_Matcher *pPVar7;
  char *pcVar8;
  pointer pvVar9;
  ulong uVar10;
  int *piVar11;
  ulong uVar12;
  iterator __begin1;
  pointer pbVar13;
  pointer pPVar14;
  pointer pbVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  int j;
  int iVar19;
  pointer pPVar20;
  iterator __end1;
  int pos_best;
  int local_11c;
  char *arg;
  pointer piStack_110;
  pointer local_108;
  string tmp;
  ulong local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  int local_94;
  ulong local_90;
  tvec_t hashed;
  svec_t keys;
  cvec_t args;
  
  pPVar7 = this->impl;
  if (pPVar7 != (Port_Matcher *)0x0) {
    Port_Matcher::~Port_Matcher(pPVar7);
  }
  operator_delete(pPVar7,0x80);
  pPVar7 = (Port_Matcher *)operator_new(0x80);
  Port_Matcher::Port_Matcher
            (pPVar7,(int)(((long)(this->ports).
                                 super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->ports).
                                super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>.
                                _M_impl.super__Vector_impl_data._M_start) / 0x38));
  this->impl = pPVar7;
  keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pPVar20 = (this->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
            super__Vector_impl_data._M_start;
  pPVar14 = (this->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
            super__Vector_impl_data._M_finish;
  bVar3 = false;
  for (uVar4 = 0; (ulong)uVar4 < (ulong)(((long)pPVar14 - (long)pPVar20) / 0x38); uVar4 = uVar4 + 1)
  {
    pcVar8 = strchr(pPVar20[uVar4].name,0x23);
    bVar3 = (bool)(bVar3 | pcVar8 != (char *)0x0);
  }
  if (!bVar3) {
    for (uVar4 = 0; uVar10 = (ulong)uVar4, uVar10 < (ulong)(((long)pPVar14 - (long)pPVar20) / 0x38);
        uVar4 = uVar4 + 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&tmp,pPVar20[uVar10].name,(allocator<char> *)&hashed);
      arg = (char *)0x0;
      uVar5 = std::__cxx11::string::find('\0',0x3a);
      if (0 < (int)uVar5) {
        arg = (this->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
              super__Vector_impl_data._M_start[uVar10].name + (uVar5 & 0x7fffffff);
        std::__cxx11::string::substr((ulong)&hashed,(ulong)&tmp);
        std::__cxx11::string::operator=((string *)&tmp,(string *)&hashed);
        std::__cxx11::string::~string((string *)&hashed);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&keys,&tmp);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back(&args,&arg);
      std::__cxx11::string::~string((string *)&tmp);
      pPVar20 = (this->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
                super__Vector_impl_data._M_start;
      pPVar14 = (this->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&pPVar7->fixed,&keys);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::operator=(&pPVar7->arg_spec,&args);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_b0,&keys);
    pbVar15 = local_b0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (local_b0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_b0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      arg = (char *)0x0;
      piStack_110 = (pointer)0x0;
      local_108 = (pointer)0x0;
      local_d8 = (ulong)((long)local_b0.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_b0.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 5;
      iVar6 = 0;
      for (pbVar13 = local_b0.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar15;
          pbVar13 = pbVar13 + 1) {
        std::__cxx11::string::string((string *)&tmp,(string *)pbVar13);
        if (iVar6 <= (int)tmp._M_string_length) {
          iVar6 = (int)tmp._M_string_length;
        }
        std::__cxx11::string::~string((string *)&tmp);
      }
      pos_best = -1;
      uVar4 = 0x7fffffff;
      while( true ) {
        for (local_11c = 0; local_11c < iVar6; local_11c = local_11c + 1) {
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&tmp,
                     (vector<int,_std::allocator<int>_> *)&arg);
          bVar3 = has<std::vector<int,std::allocator<int>>,int>
                            ((vector<int,_std::allocator<int>_> *)&arg,&local_11c);
          if (!bVar3) {
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)&tmp,&local_11c);
            do_hash(&hashed,&local_b0,(ivec_t *)&tmp);
            uVar5 = count_dups<std::vector<int,std::allocator<int>>>(&hashed);
            if ((int)uVar5 < (int)uVar4) {
              pos_best = local_11c;
              uVar4 = uVar5;
            }
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::~vector(&hashed);
          }
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&tmp);
        }
        if ((int)local_d8 <= (int)uVar4) break;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)&arg,&pos_best);
        local_d8 = (ulong)uVar4;
      }
      do_hash((tvec_t *)&tmp,&local_b0,(ivec_t *)&arg);
      iVar6 = count_dups<std::vector<int,std::allocator<int>>>
                        ((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          *)&tmp);
      if ((iVar6 != 0) && (piStack_110 != (pointer)arg)) {
        piStack_110 = (pointer)arg;
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&tmp);
      pos = &pPVar7->pos;
      std::vector<int,_std::allocator<int>_>::_M_move_assign
                (pos,(_Vector_base<int,_std::allocator<int>_> *)&arg);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&arg);
      if ((pPVar7->pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (pPVar7->pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        fwrite("rtosc: Failed to generate minimal hash\n",0x27,1,_stderr);
      }
      else {
        arg = (char *)0x0;
        piStack_110 = (pointer)0x0;
        local_108 = (pointer)0x0;
        hashed.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_90 = (ulong)((long)local_b0.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_b0.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 5;
        hashed.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        hashed.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        for (pbVar15 = local_b0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            pbVar15 !=
            local_b0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish; pbVar15 = pbVar15 + 1) {
          std::__cxx11::string::string((string *)&tmp,(string *)pbVar15);
          lVar17 = CONCAT44(tmp._M_dataplus._M_p._4_4_,tmp._M_dataplus._M_p._0_4_);
          lVar1 = CONCAT44(tmp._M_string_length._4_4_,(int)tmp._M_string_length);
          for (lVar18 = 0; lVar1 != lVar18; lVar18 = lVar18 + 1) {
            pos_best = CONCAT31(pos_best._1_3_,*(undefined1 *)(lVar17 + lVar18));
            bVar3 = has<std::vector<char,std::allocator<char>>,char>
                              ((vector<char,_std::allocator<char>_> *)&hashed,(char *)&pos_best);
            if (!bVar3) {
              std::vector<char,_std::allocator<char>_>::push_back
                        ((vector<char,_std::allocator<char>_> *)&hashed,
                         (value_type_conflict *)&pos_best);
            }
          }
          std::__cxx11::string::~string((string *)&tmp);
        }
        iVar6 = 0x7f;
        while (bVar3 = iVar6 != 0, iVar6 = iVar6 + -1, bVar3) {
          tmp._M_dataplus._M_p._0_4_ = 0;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)&arg,(int *)&tmp);
        }
        iVar19 = 0;
        uVar4 = 0x7fffffff;
        iVar6 = -1;
        do {
          pvVar2 = hashed.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pvVar9 = hashed.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (iVar19 == 4) break;
          for (; local_94 = iVar19, pvVar9 != pvVar2;
              pvVar9 = (pointer)((long)&(pvVar9->super__Vector_base<int,_std::allocator<int>_>).
                                        _M_impl.super__Vector_impl_data._M_start + 1)) {
            lVar17 = (long)*(char *)&(pvVar9->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                     .super__Vector_impl_data._M_start;
            uVar4 = 0x7fffffff;
            for (iVar19 = 0; iVar19 != 100; iVar19 = iVar19 + 1) {
              *(int *)(arg + lVar17 * 4) = iVar19;
              do_hash((ivec_t *)&tmp,&local_b0,pos,(ivec_t *)&arg);
              uVar5 = count_dups<int>((vector<int,_std::allocator<int>_> *)&tmp);
              if ((int)uVar5 < (int)uVar4) {
                uVar4 = uVar5;
                iVar6 = iVar19;
              }
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                        ((_Vector_base<int,_std::allocator<int>_> *)&tmp);
            }
            *(int *)(arg + lVar17 * 4) = iVar6;
            iVar19 = local_94;
          }
          iVar19 = local_94 + 1;
          bVar3 = (int)uVar4 < (int)local_90;
          local_90 = (ulong)uVar4;
        } while (bVar3);
        do_hash((ivec_t *)&tmp,&local_b0,pos,(ivec_t *)&arg);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&tmp);
        std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                  ((_Vector_base<char,_std::allocator<char>_> *)&hashed);
        std::vector<int,_std::allocator<int>_>::_M_move_assign
                  (&pPVar7->assoc,(_Vector_base<int,_std::allocator<int>_> *)&arg);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&arg);
        hashed.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        hashed.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        hashed.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        do_hash((ivec_t *)&tmp,&local_b0,pos,&pPVar7->assoc);
        iVar6 = 0;
        for (piVar11 = (int *)CONCAT44(tmp._M_dataplus._M_p._4_4_,tmp._M_dataplus._M_p._0_4_);
            piVar11 != (int *)CONCAT44(tmp._M_string_length._4_4_,(int)tmp._M_string_length);
            piVar11 = piVar11 + 1) {
          if (iVar6 <= *piVar11 + 1) {
            iVar6 = *piVar11 + 1;
          }
        }
        iVar19 = 0;
        if (0 < iVar6) {
          iVar19 = iVar6;
        }
        while (bVar3 = iVar19 != 0, iVar19 = iVar19 + -1, bVar3) {
          arg = (char *)((ulong)arg & 0xffffffff00000000);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)&hashed,(int *)&arg);
        }
        uVar12 = (ulong)(CONCAT44(tmp._M_string_length._4_4_,(int)tmp._M_string_length) -
                        CONCAT44(tmp._M_dataplus._M_p._4_4_,tmp._M_dataplus._M_p._0_4_)) >> 2;
        uVar16 = 0;
        uVar10 = uVar12 & 0xffffffff;
        if ((int)uVar12 < 1) {
          uVar10 = uVar16;
        }
        for (; uVar10 != uVar16; uVar16 = uVar16 + 1) {
          *(int *)((long)&((hashed.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start +
                  (long)*(int *)(CONCAT44(tmp._M_dataplus._M_p._4_4_,tmp._M_dataplus._M_p._0_4_) +
                                uVar16 * 4) * 4) = (int)uVar16;
        }
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&tmp);
        std::vector<int,_std::allocator<int>_>::_M_move_assign
                  (&pPVar7->remap,(_Vector_base<int,_std::allocator<int>_> *)&hashed);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&hashed);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b0);
  }
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&keys);
  pPVar20 = (this->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar10 = ((long)(this->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pPVar20) / 0x38;
  pPVar7 = this->impl;
  uVar12 = 0;
  uVar4 = (uint)uVar10;
  uVar16 = 0;
  if (0 < (int)uVar4) {
    uVar16 = uVar10 & 0xffffffff;
  }
  for (; uVar16 != uVar12; uVar12 = uVar12 + 1) {
    pcVar8 = strchr(pPVar20->name,0x23);
    pPVar7->m_enump[uVar12] = pcVar8 != (char *)0x0;
    pPVar20 = pPVar20 + 1;
  }
  this->elms = uVar4;
  return;
}

Assistant:

void Ports::refreshMagic()
{
    delete impl;
    impl = new Port_Matcher(ports.size());
    generate_minimal_hash(*this, *impl);
    for(int i=0; i<(int)ports.size(); ++i)
        impl->set_enump(i, !!strchr(ports[i].name, '#'));

    elms = ports.size();
}